

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void __thiscall
PartiallySignedTransaction::Serialize<DataStream>(PartiallySignedTransaction *this,DataStream *s)

{
  PSBTInput *pPVar1;
  PSBTOutput *pPVar2;
  KeyOriginInfo hd_keypath;
  uint32_t uVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  PSBTInput *input;
  PSBTInput *this_00;
  PSBTOutput *this_01;
  long in_FS_OFFSET;
  uchar ser_xpub [78];
  undefined8 in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar7;
  _Rb_tree_color local_a8 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  ParamsWrapper<TransactionSerParams,_const_CMutableTransaction> local_88 [5];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,PSBT_MAGIC_BYTES,&::TX_NO_WITNESS);
  local_88[0].m_params = (TransactionSerParams *)0x0;
  SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)local_88);
  local_88[0].m_params = &::TX_NO_WITNESS;
  local_88[0].m_object = (CMutableTransaction *)this;
  SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,CMutableTransaction_const>>
            (s,local_88);
  p_Var5 = (this->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != p_Var6) {
    do {
      p_Var4 = p_Var5[2]._M_right;
      if (p_Var4 != (_Rb_tree_node_base *)&p_Var5[2]._M_parent) {
        do {
          CExtPubKey::EncodeWithVersion((CExtPubKey *)(p_Var4 + 1),(uchar *)local_88);
          uVar7 = 0x4f;
          std::vector<std::byte,zero_after_free_allocator<std::byte>>::
          _M_range_insert<std::byte_const*>
                    ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
                     (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&stack0xffffffffffffff57,local_a8);
          SerializeMany<DataStream,unsigned_char,unsigned_char[78]>
                    (s,"\x01\x13\x14\x15\x16\x17\x18\x05\x06\a",(uchar (*) [78])local_88);
          local_a8[0] = p_Var5[1]._M_color;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_a0,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var5[1]._M_parent);
          hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)this;
          hd_keypath.fingerprint[0] = (char)in_stack_ffffffffffffff38;
          hd_keypath.fingerprint[1] = (char)((ulong)in_stack_ffffffffffffff38 >> 8);
          hd_keypath.fingerprint[2] = (char)((ulong)in_stack_ffffffffffffff38 >> 0x10);
          hd_keypath.fingerprint[3] = (char)((ulong)in_stack_ffffffffffffff38 >> 0x18);
          hd_keypath._4_4_ = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
          hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = &p_Var6->_M_color;
          hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_ffffffffffffff50;
          hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = uVar7;
          SerializeHDKeypath<DataStream>(s,hd_keypath);
          if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_a0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        } while (p_Var4 != (_Rb_tree_node_base *)&p_Var5[2]._M_parent);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != p_Var6);
  }
  uVar3 = GetVersion(this);
  if (uVar3 != 0) {
    local_88[0].m_params = (TransactionSerParams *)0xfb;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)local_88);
    SerializeToVector<DataStream,unsigned_int>(s,(uint *)&this->m_version);
  }
  for (p_Var6 = (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    DataStream::operator<<(s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var6 + 2));
    DataStream::operator<<
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var6[2]._M_right);
  }
  for (p_Var6 = (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->unknown)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    DataStream::operator<<(s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var6 + 1));
    DataStream::operator<<
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var6[1]._M_right);
  }
  local_88[0].m_params = (TransactionSerParams *)((ulong)local_88[0].m_params & 0xffffffffffffff00);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,local_88);
  pPVar1 = (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1) {
    PSBTInput::Serialize<DataStream>(this_00,s);
  }
  pPVar2 = (this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_01 = (this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl
                 .super__Vector_impl_data._M_start; this_01 != pPVar2; this_01 = this_01 + 1) {
    PSBTOutput::Serialize<DataStream>(this_01,s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void Serialize(Stream& s) const {

        // magic bytes
        s << PSBT_MAGIC_BYTES;

        // unsigned tx flag
        SerializeToVector(s, CompactSizeWriter(PSBT_GLOBAL_UNSIGNED_TX));

        // Write serialized tx to a stream
        SerializeToVector(s, TX_NO_WITNESS(*tx));

        // Write xpubs
        for (const auto& xpub_pair : m_xpubs) {
            for (const auto& xpub : xpub_pair.second) {
                unsigned char ser_xpub[BIP32_EXTKEY_WITH_VERSION_SIZE];
                xpub.EncodeWithVersion(ser_xpub);
                // Note that the serialization swaps the key and value
                // The xpub is the key (for uniqueness) while the path is the value
                SerializeToVector(s, PSBT_GLOBAL_XPUB, ser_xpub);
                SerializeHDKeypath(s, xpub_pair.first);
            }
        }

        // PSBT version
        if (GetVersion() > 0) {
            SerializeToVector(s, CompactSizeWriter(PSBT_GLOBAL_VERSION));
            SerializeToVector(s, *m_version);
        }

        // Write proprietary things
        for (const auto& entry : m_proprietary) {
            s << entry.key;
            s << entry.value;
        }

        // Write the unknown things
        for (auto& entry : unknown) {
            s << entry.first;
            s << entry.second;
        }

        // Separator
        s << PSBT_SEPARATOR;

        // Write inputs
        for (const PSBTInput& input : inputs) {
            s << input;
        }
        // Write outputs
        for (const PSBTOutput& output : outputs) {
            s << output;
        }
    }